

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubDMeshImpl::AddFinishedFragment(ON_SubDMeshImpl *this,ON_SubDMeshFragment *finished_fragment)

{
  ON_SubDMeshFragment *pOVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  uint uVar8;
  ON__UINT64 OVar9;
  
  if ((((finished_fragment != (ON_SubDMeshFragment *)0x0) &&
       (uVar7 = ON_SubDMeshFragment::PointCount(finished_fragment), uVar7 != 0)) &&
      (uVar8 = ON_SubDMeshFragment::NormalCount(finished_fragment), uVar8 != 0)) &&
     (uVar7 <= this->m_fragment_point_count)) {
    this->m_fragment_count = this->m_fragment_count + 1;
    if (this->m_first_fragment == (ON_SubDMeshFragment *)0x0) {
      this->m_first_fragment = finished_fragment;
      this->m_last_fragment = finished_fragment;
      dVar2 = (finished_fragment->m_surface_bbox).m_min.y;
      dVar3 = (finished_fragment->m_surface_bbox).m_min.z;
      dVar4 = (finished_fragment->m_surface_bbox).m_max.x;
      dVar5 = (finished_fragment->m_surface_bbox).m_max.y;
      dVar6 = (finished_fragment->m_surface_bbox).m_max.z;
      (this->m_bbox).m_min.x = (finished_fragment->m_surface_bbox).m_min.x;
      (this->m_bbox).m_min.y = dVar2;
      (this->m_bbox).m_min.z = dVar3;
      (this->m_bbox).m_max.x = dVar4;
      (this->m_bbox).m_max.y = dVar5;
      (this->m_bbox).m_max.z = dVar6;
    }
    else {
      pOVar1 = this->m_last_fragment;
      pOVar1->m_next_fragment = finished_fragment;
      finished_fragment->m_prev_fragment = pOVar1;
      this->m_last_fragment = finished_fragment;
      ON_BoundingBox::Union(&this->m_bbox,&finished_fragment->m_surface_bbox);
    }
    OVar9 = ON_NextContentSerialNumber();
    this->m_mesh_content_serial_number = OVar9;
    return true;
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDMeshImpl::AddFinishedFragment(
  ON_SubDMeshFragment* finished_fragment
  )
{
  if ( nullptr == finished_fragment)
    return ON_SUBD_RETURN_ERROR(false);
  if ( 0 == finished_fragment->PointCount() || 0 == finished_fragment->NormalCount() )
    return ON_SUBD_RETURN_ERROR(false);
  if ( finished_fragment->PointCount() > m_fragment_point_count )
    return ON_SUBD_RETURN_ERROR(false);

  m_fragment_count++;

  if (nullptr == m_first_fragment)
  {
    m_first_fragment = finished_fragment;
    m_last_fragment = finished_fragment;
    m_bbox = finished_fragment->m_surface_bbox;
  }
  else
  {
    m_last_fragment->m_next_fragment = finished_fragment;
    finished_fragment->m_prev_fragment = m_last_fragment;
    m_last_fragment = finished_fragment;
    m_bbox.Union(finished_fragment->m_surface_bbox);
  }

  ChangeContentSerialNumber();

  return true;
}